

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall
kratos::Simulator::trigger_event
          (Simulator *this,Var *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *bits_mask)

{
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *puVar1;
  ulong uVar2;
  enable_shared_from_this<kratos::Var> *peVar3;
  mapped_type *pmVar4;
  __node_base_ptr p_Var5;
  mapped_type *pmVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  __hash_code __code;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  Var *pVVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  long *plVar14;
  undefined1 local_98 [8];
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  vs;
  key_type local_50;
  Var *root;
  _Alloc_hider local_40;
  Var *var_local;
  
  if ((bits_mask->_M_h)._M_element_count != 0) {
    uVar2 = (this->dependency_)._M_h._M_bucket_count;
    uVar9 = (ulong)var % uVar2;
    p_Var12 = (this->dependency_)._M_h._M_buckets[uVar9];
    p_Var13 = (__node_base_ptr)0x0;
    if ((p_Var12 != (__node_base_ptr)0x0) &&
       (p_Var10 = p_Var12->_M_nxt, p_Var13 = p_Var12, (Var *)p_Var12->_M_nxt[1]._M_nxt != var)) {
      while (p_Var12 = p_Var10, p_Var10 = p_Var12->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
        p_Var13 = (__node_base_ptr)0x0;
        if (((ulong)p_Var10[1]._M_nxt % uVar2 != uVar9) ||
           (p_Var13 = p_Var12, (Var *)p_Var10[1]._M_nxt == var)) goto LAB_001d0afb;
      }
      p_Var13 = (__node_base_ptr)0x0;
    }
LAB_001d0afb:
    root = (Var *)&this->dependency_;
    local_40._M_p = (pointer)var;
    var_local = (Var *)this;
    if ((p_Var13 != (__node_base_ptr)0x0) && (p_Var13->_M_nxt != (_Hash_node_base *)0x0)) {
      pmVar4 = std::__detail::
               _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)root,(key_type *)&local_40);
      p_Var10 = (pmVar4->_M_h)._M_before_begin._M_nxt;
      if (p_Var10 != (_Hash_node_base *)0x0) {
        puVar1 = &var_local->sources_;
        peVar3 = &var_local->super_enable_shared_from_this<kratos::Var>;
        do {
          p_Var5 = std::
                   _Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::_M_find_before_node
                             ((_Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)puVar1,
                              (ulong)p_Var10[1]._M_nxt % (var_local->sources_)._M_h._M_bucket_count,
                              (key_type *)(p_Var10 + 1),(__hash_code)p_Var10[1]._M_nxt);
          if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
            vs._M_h._M_buckets = &(p_Var10[1]._M_nxt)->_M_nxt;
            local_98 = (undefined1  [8])local_40._M_p;
            std::
            deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>
            ::emplace_back<std::pair<kratos::Var_const*,kratos::Stmt*>>
                      ((deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>
                        *)&(peVar3->_M_weak_this).
                           super___weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (pair<const_kratos::Var_*,_kratos::Stmt_*> *)local_98);
          }
          p_Var10 = p_Var10->_M_nxt;
        } while (p_Var10 != (_Hash_node_base *)0x0);
      }
    }
    local_50 = (key_type)(**(code **)(*(long *)local_40._M_p + 0x140))();
    uVar2 = (var_local->sinks_)._M_h._M_bucket_count;
    uVar9 = (ulong)local_50 % uVar2;
    p_Var12 = (var_local->sinks_)._M_h._M_buckets[uVar9];
    p_Var13 = (__node_base_ptr)0x0;
    if ((p_Var12 != (__node_base_ptr)0x0) &&
       (p_Var10 = p_Var12->_M_nxt, p_Var13 = p_Var12,
       local_50 != (key_type)p_Var12->_M_nxt[1]._M_nxt)) {
      while (p_Var12 = p_Var10, p_Var10 = p_Var12->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
        p_Var13 = (__node_base_ptr)0x0;
        if (((ulong)p_Var10[1]._M_nxt % uVar2 != uVar9) ||
           (p_Var13 = p_Var12, local_50 == (key_type)p_Var10[1]._M_nxt)) goto LAB_001d0c14;
      }
      p_Var13 = (__node_base_ptr)0x0;
    }
LAB_001d0c14:
    pVVar11 = var_local;
    if ((p_Var13 != (__node_base_ptr)0x0) && (p_Var13->_M_nxt != (_Hash_node_base *)0x0)) {
      pmVar6 = std::__detail::
               _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&var_local->sinks_,&local_50);
      local_98 = (undefined1  [8])&vs._M_h._M_rehash_policy._M_next_resize;
      vs._M_h._M_buckets = (__buckets_ptr)0x1;
      vs._M_h._M_bucket_count = 0;
      vs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      vs._M_h._M_element_count._0_4_ = 0x3f800000;
      vs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      vs._M_h._M_rehash_policy._4_4_ = 0;
      vs._M_h._M_rehash_policy._M_next_resize = 0;
      p_Var10 = (pmVar6->_M_h)._M_before_begin._M_nxt;
      if (p_Var10 != (_Hash_node_base *)0x0) {
        do {
          p_Var7 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::_M_find_before_node
                             (&bits_mask->_M_h,
                              (ulong)*(uint *)&p_Var10[1]._M_nxt % (bits_mask->_M_h)._M_bucket_count
                              ,(key_type *)(p_Var10 + 1),(ulong)*(uint *)&p_Var10[1]._M_nxt);
          if ((p_Var7 != (__node_base_ptr)0x0) && (p_Var7->_M_nxt != (_Hash_node_base *)0x0)) {
            std::
            _Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<kratos::Var*const&>
                      ((_Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_98,p_Var10 + 2);
          }
          p_Var10 = p_Var10->_M_nxt;
        } while (p_Var10 != (_Hash_node_base *)0x0);
      }
      if (vs._M_h._M_bucket_count != 0) {
        puVar1 = &var_local->sources_;
        peVar3 = &var_local->super_enable_shared_from_this<kratos::Var>;
        plVar14 = (long *)vs._M_h._M_bucket_count;
        do {
          p_Var8 = std::
                   _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::_M_find_before_node
                             ((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)root,(ulong)plVar14[1] %
                                      (ulong)(var_local->size_param_)._M_h._M_before_begin._M_nxt,
                              (key_type *)(plVar14 + 1),plVar14[1]);
          if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
            pmVar4 = std::__detail::
                     _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)root,(key_type *)(plVar14 + 1));
            for (p_Var10 = (pmVar4->_M_h)._M_before_begin._M_nxt; p_Var10 != (_Hash_node_base *)0x0;
                p_Var10 = p_Var10->_M_nxt) {
              p_Var5 = std::
                       _Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::_M_find_before_node
                                 ((_Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                   *)puVar1,
                                  (ulong)p_Var10[1]._M_nxt %
                                  (var_local->sources_)._M_h._M_bucket_count,
                                  (key_type *)(p_Var10 + 1),(__hash_code)p_Var10[1]._M_nxt);
              if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
                vs._M_h._M_single_bucket = (__node_base_ptr)local_40._M_p;
                std::
                deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>
                ::emplace_back<std::pair<kratos::Var_const*,kratos::Stmt*>>
                          ((deque<std::pair<kratos::Var_const*,kratos::Stmt*>,std::allocator<std::pair<kratos::Var_const*,kratos::Stmt*>>>
                            *)&(peVar3->_M_weak_this).
                               super___weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ,(pair<const_kratos::Var_*,_kratos::Stmt_*> *)&vs._M_h._M_single_bucket);
              }
            }
          }
          plVar14 = (long *)*plVar14;
        } while (plVar14 != (long *)0x0);
      }
      pVVar11 = var_local;
      std::
      _Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_98);
    }
    (pVVar11->before_var_str_)._M_dataplus._M_p = (pVVar11->before_var_str_)._M_dataplus._M_p + 1;
  }
  return;
}

Assistant:

void Simulator::trigger_event(const kratos::Var *var,
                              const std::unordered_set<uint32_t> &bits_mask) {
    if (bits_mask.empty()) return;

    if (dependency_.find(var) != dependency_.end()) {
        auto const &deps = dependency_.at(var);
        for (auto const &stmt : deps) {
            if (scope_.find(stmt) == scope_.end()) event_queue_.emplace(std::make_pair(var, stmt));
        }
    }

    const auto *root = var->get_var_root_parent();
    if (linked_dependency_.find(root) != linked_dependency_.end()) {
        auto const &vars = linked_dependency_.at(root);
        std::unordered_set<Var *> vs;
        for (const auto &[bit, v] : vars) {
            if (bits_mask.find(bit) != bits_mask.end()) vs.emplace(v);
        }

        for (auto const &v : vs) {
            if (dependency_.find(v) != dependency_.end()) {
                auto const &deps = dependency_.at(v);
                for (auto const &stmt : deps) {
                    if (scope_.find(stmt) == scope_.end())
                        event_queue_.emplace(std::make_pair(var, stmt));
                }
            }
        }
    }

    // trigger linked events as well
    simulation_depth_++;
}